

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

wchar_t int_to_roman(wchar_t n,char *roman,size_t bufsize)

{
  size_t sVar1;
  size_t sVar2;
  int local_8c;
  wchar_t local_88;
  wchar_t i;
  wchar_t roman_symbol_values [13];
  char local_48 [8];
  char roman_symbol_labels [13] [3];
  size_t bufsize_local;
  char *roman_local;
  wchar_t n_local;
  
  unique0x10000174 = bufsize;
  memcpy(local_48,&DAT_0030f480,0x27);
  memcpy(&local_88,&DAT_0030f4b0,0x34);
  *roman = '\0';
  roman_local._0_4_ = n;
  if (n < L'\x01') {
    roman_local._4_4_ = L'\0';
  }
  else {
    for (; L'\0' < (wchar_t)roman_local;
        roman_local._0_4_ = (wchar_t)roman_local - (&local_88)[local_8c]) {
      for (local_8c = 0; (wchar_t)roman_local < (&local_88)[local_8c]; local_8c = local_8c + 1) {
      }
      sVar1 = strlen(roman);
      sVar2 = strlen(roman_symbol_labels[(long)local_8c + -3] + 1);
      if (stack0xffffffffffffffe0 < sVar1 + sVar2 + 1) break;
      my_strcat(roman,roman_symbol_labels[(long)local_8c + -3] + 1,stack0xffffffffffffffe0);
    }
    if ((wchar_t)roman_local < L'\x01') {
      roman_local._4_4_ = L'\x01';
    }
    else {
      *roman = '\0';
      roman_local._4_4_ = L'\0';
    }
  }
  return roman_local._4_4_;
}

Assistant:

static int int_to_roman(int n, char *roman, size_t bufsize)
{
	/* Roman symbols */
	char roman_symbol_labels[13][3] =
		{"M", "CM", "D", "CD", "C", "XC", "L", "XL", "X", "IX",
		 "V", "IV", "I"};
	int  roman_symbol_values[13] =
		{1000, 900, 500, 400, 100, 90, 50, 40, 10, 9, 5, 4, 1};

	/* Clear the roman numeral buffer */
	roman[0] = '\0';

	/* Roman numerals have no zero or negative numbers */
	if (n < 1)
		return 0;

	/* Build the roman numeral in the buffer */
	while (n > 0) {
		int i = 0;

		/* Find the largest possible roman symbol */
		while (n < roman_symbol_values[i])
			i++;

		/* No room in buffer, so abort */
		if (strlen(roman) + strlen(roman_symbol_labels[i]) + 1
			> bufsize)
			break;

		/* Add the roman symbol to the buffer */
		my_strcat(roman, roman_symbol_labels[i], bufsize);

		/* Decrease the value of the arabic numeral */
		n -= roman_symbol_values[i];
	}

	/* Ran out of space and aborted */
	if (n > 0) {
		/* Clean up and return */
		roman[0] = '\0';

		return 0;
	}

	return 1;
}